

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

bool __thiscall
Remapper::remap_uav(Remapper *this,D3DUAVBinding *binding,VulkanUAVBinding *vk_binding)

{
  dxil_spv_bool dVar1;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 local_90 [8];
  dxil_spv_uav_vulkan_binding c_vk_binding;
  dxil_spv_uav_d3d_binding c_binding;
  VulkanUAVBinding *vk_binding_local;
  D3DUAVBinding *binding_local;
  Remapper *this_local;
  
  if (this->uav_remapper == (dxil_spv_uav_remapper_cb)0x0) {
    (vk_binding->buffer_binding).bindless.use_heap = false;
    (vk_binding->counter_binding).bindless.use_heap = false;
    (vk_binding->buffer_binding).descriptor_set = (binding->binding).register_space;
    (vk_binding->buffer_binding).binding = (binding->binding).register_index;
    (vk_binding->counter_binding).descriptor_set = (binding->binding).register_space + 1;
    (vk_binding->counter_binding).binding = (binding->binding).register_index;
    (vk_binding->buffer_binding).descriptor_type = Identity;
    (vk_binding->counter_binding).descriptor_type = Identity;
    memset(&local_a8,0,0x18);
    (vk_binding->offset_binding).descriptor_set = (undefined4)local_a8;
    (vk_binding->offset_binding).binding = local_a8._4_4_;
    (vk_binding->offset_binding).root_constant_index = (undefined4)local_a0;
    (vk_binding->offset_binding).bindless.heap_root_offset = local_a0._4_4_;
    *(undefined8 *)&(vk_binding->offset_binding).bindless.use_heap = local_98;
    this_local._7_1_ = true;
  }
  else {
    c_vk_binding.offset_binding.bindless._4_4_ = (binding->binding).stage;
    c_vk_binding.offset_binding.descriptor_type =
         (dxil_spv_vulkan_descriptor_type)(binding->binding).kind;
    memset(local_90,0,0x48);
    dVar1 = (*this->uav_remapper)
                      (this->uav_userdata,
                       (dxil_spv_uav_d3d_binding *)&c_vk_binding.offset_binding.bindless.use_heap,
                       (dxil_spv_uav_vulkan_binding *)local_90);
    if (dVar1 == '\x01') {
      copy_buffer_binding(&vk_binding->buffer_binding,(dxil_spv_vulkan_binding *)local_90);
      copy_buffer_binding(&vk_binding->counter_binding,
                          (dxil_spv_vulkan_binding *)&c_vk_binding.buffer_binding.bindless.use_heap)
      ;
      copy_buffer_binding(&vk_binding->offset_binding,
                          (dxil_spv_vulkan_binding *)&c_vk_binding.counter_binding.bindless.use_heap
                         );
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool remap_uav(const D3DUAVBinding &binding, VulkanUAVBinding &vk_binding) override
	{
		if (uav_remapper)
		{
			const dxil_spv_uav_d3d_binding c_binding = {
				{ static_cast<dxil_spv_shader_stage>(binding.binding.stage),
				  static_cast<dxil_spv_resource_kind>(binding.binding.kind), binding.binding.resource_index,
				  binding.binding.register_space, binding.binding.register_index, binding.binding.range_size,
				  binding.binding.alignment },
				binding.counter ? DXIL_SPV_TRUE : DXIL_SPV_FALSE
			};

			dxil_spv_uav_vulkan_binding c_vk_binding = {};
			if (uav_remapper(uav_userdata, &c_binding, &c_vk_binding) == DXIL_SPV_TRUE)
			{
				copy_buffer_binding(vk_binding.buffer_binding, c_vk_binding.buffer_binding);
				copy_buffer_binding(vk_binding.counter_binding, c_vk_binding.counter_binding);
				copy_buffer_binding(vk_binding.offset_binding, c_vk_binding.offset_binding);
				return true;
			}
			else
				return false;
		}
		else
		{
			vk_binding.buffer_binding.bindless.use_heap = false;
			vk_binding.counter_binding.bindless.use_heap = false;
			vk_binding.buffer_binding.descriptor_set = binding.binding.register_space;
			vk_binding.buffer_binding.binding = binding.binding.register_index;
			vk_binding.counter_binding.descriptor_set = binding.binding.register_space + 1;
			vk_binding.counter_binding.binding = binding.binding.register_index;
			vk_binding.buffer_binding.descriptor_type = VulkanDescriptorType::Identity;
			vk_binding.counter_binding.descriptor_type = VulkanDescriptorType::Identity;
			vk_binding.offset_binding = {};
			return true;
		}
	}